

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O3

void __thiscall
QDeadlineTimer::QDeadlineTimer<int,std::ratio<1l,1000l>>
          (QDeadlineTimer *this,duration<int,_std::ratio<1L,_1000L>_> remaining,TimerType type_)

{
  this->t1 = 0;
  this->t2 = 0;
  this->type = 1;
  if (remaining.__r == 0x7fffffff) {
    this->t1 = 0x7fffffffffffffff;
    this->t2 = 0;
    this->type = type_;
    return;
  }
  setPreciseRemainingTime(this,0,(long)remaining.__r * 1000000,type_);
  return;
}

Assistant:

QDeadlineTimer(std::chrono::duration<Rep, Period> remaining, Qt::TimerType type_ = Qt::CoarseTimer)
        : t2(0)
    { setRemainingTime(remaining, type_); }